

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

char * getSelectionString(Atom selection)

{
  long *plVar1;
  int iVar2;
  Window WVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  size_t __size;
  bool bVar7;
  undefined1 local_208 [8];
  XEvent dummy;
  XEvent notification;
  unsigned_long bytesAfter;
  Atom local_78;
  Atom targets [2];
  Atom actualType;
  undefined1 local_54 [4];
  ulong uStack_50;
  int actualFormat;
  unsigned_long itemCount;
  char *data;
  char *local_38;
  
  local_78 = _glfw.x11.UTF8_STRING;
  targets[0] = 0x1f;
  lVar6 = (ulong)(_glfw.x11.PRIMARY != selection) * 8;
  pcVar5 = (char *)(lVar6 + 0x1ff08);
  bytesAfter = selection;
  WVar3 = XGetSelectionOwner(_glfw.x11.display);
  if (WVar3 != _glfw.x11.helperWindowHandle) {
    free(*(void **)((long)_glfw.x11.keynames + lVar6 + -0x10));
    data = pcVar5;
    *(undefined8 *)((long)_glfw.x11.keynames + lVar6 + -0x10) = 0;
    plVar1 = dummy.pad + 0x17;
    lVar6 = 0;
    do {
      local_38 = (char *)targets[lVar6 + -1];
      XConvertSelection(_glfw.x11.display,bytesAfter,local_38,_glfw.x11.GLFW_SELECTION,
                        _glfw.x11.helperWindowHandle,0);
      while (iVar2 = XCheckTypedWindowEvent
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,plVar1),
            iVar2 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.subwindow == 0) {
        bVar7 = false;
      }
      else {
        XCheckIfEvent(_glfw.x11.display,local_208,isSelPropNewValueNotify,plVar1);
        XGetWindowProperty(_glfw.x11.display,notification.xany.display,notification.xkey.subwindow,0
                           ,0x7fffffffffffffff,1,0,targets + 1,local_54,&stack0xffffffffffffffb0,
                           notification.pad + 0x17,&itemCount);
        if (targets[1] == _glfw.x11.INCR) {
          __size = 1;
          local_38 = (char *)0x0;
          do {
            while (iVar2 = XCheckIfEvent(_glfw.x11.display,local_208,isSelPropNewValueNotify,plVar1)
                  , iVar2 == 0) {
              waitForEvent((double *)0x0);
            }
            XFree(itemCount);
            XGetWindowProperty(_glfw.x11.display,notification.xany.display,
                               notification.xkey.subwindow,0,0x7fffffffffffffff,1,0,targets + 1,
                               local_54,&stack0xffffffffffffffb0,notification.pad + 0x17,&itemCount)
            ;
            if (uStack_50 != 0) {
              __size = __size + uStack_50;
              local_38 = (char *)realloc(local_38,__size);
              local_38[~uStack_50 + __size] = '\0';
              strcat(local_38,(char *)itemCount);
            }
          } while (uStack_50 != 0);
          pcVar5 = local_38;
          if (targets[lVar6 + -1] == 0x1f) {
            pcVar4 = convertLatin1toUTF8(local_38);
            pcVar5 = data;
            *(char **)(data + 0x151a90) = pcVar4;
            free(local_38);
          }
          else {
LAB_0011fe37:
            *(char **)(data + 0x151a90) = pcVar5;
            pcVar5 = data;
          }
        }
        else {
          pcVar5 = data;
          if ((char *)targets[1] == local_38) {
            if (local_38 == (char *)0x1f) {
              pcVar5 = convertLatin1toUTF8((char *)itemCount);
            }
            else {
              pcVar5 = _glfw_strdup((char *)itemCount);
            }
            goto LAB_0011fe37;
          }
        }
        XFree(itemCount);
        bVar7 = *(long *)(pcVar5 + 0x151a90) != 0;
      }
      pcVar5 = data;
    } while ((!bVar7) && (bVar7 = lVar6 == 0, lVar6 = lVar6 + 1, bVar7));
    if (*(long *)(data + 0x151a90) == 0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
    }
  }
  return *(char **)(pcVar5 + 0x151a90);
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}